

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::AdaptEcdsaAdaptorRequest,cfd::js::api::json::SignatureDataResponse,cfd::js::api::AdaptEcdsaAdaptorRequestStruct,cfd::js::api::SignatureDataResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::AdaptEcdsaAdaptorRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_510;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_458 [4];
  JsonClassBase<cfd::js::api::json::SignatureDataResponse> local_438 [4];
  undefined1 local_418 [8];
  SignatureDataResponse res_2;
  undefined1 local_3b8 [8];
  SignatureDataResponseStruct response;
  AdaptEcdsaAdaptorRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_98 [8];
  AdaptEcdsaAdaptorRequest req;
  function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::AdaptEcdsaAdaptorRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._112_8_ = call_function;
  AdaptEcdsaAdaptorRequest::AdaptEcdsaAdaptorRequest((AdaptEcdsaAdaptorRequest *)local_98);
  core::JsonClassBase<cfd::js::api::json::AdaptEcdsaAdaptorRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::AdaptEcdsaAdaptorRequest> *)local_98,request_message
            );
  AdaptEcdsaAdaptorRequest::ConvertToStruct
            ((AdaptEcdsaAdaptorRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (AdaptEcdsaAdaptorRequest *)local_98);
  std::
  function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::AdaptEcdsaAdaptorRequestStruct_&)>
  ::operator()((SignatureDataResponseStruct *)local_3b8,call_function,
               (AdaptEcdsaAdaptorRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    SignatureDataResponse::SignatureDataResponse((SignatureDataResponse *)local_418);
    SignatureDataResponse::ConvertFromStruct
              ((SignatureDataResponse *)local_418,(SignatureDataResponseStruct *)local_3b8);
    core::JsonClassBase<cfd::js::api::json::SignatureDataResponse>::Serialize_abi_cxx11_(local_438);
    std::__cxx11::string::operator=((string *)this,(string *)local_438);
    std::__cxx11::string::~string((string *)local_438);
    SignatureDataResponse::~SignatureDataResponse((SignatureDataResponse *)local_418);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_510,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_458);
    std::__cxx11::string::operator=((string *)this,(string *)local_458);
    std::__cxx11::string::~string((string *)local_458);
    ErrorResponse::~ErrorResponse(&local_510);
  }
  res_2._87_1_ = 1;
  SignatureDataResponseStruct::~SignatureDataResponseStruct
            ((SignatureDataResponseStruct *)local_3b8);
  AdaptEcdsaAdaptorRequestStruct::~AdaptEcdsaAdaptorRequestStruct
            ((AdaptEcdsaAdaptorRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  AdaptEcdsaAdaptorRequest::~AdaptEcdsaAdaptorRequest((AdaptEcdsaAdaptorRequest *)local_98);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}